

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media-adv.c
# Opt level: O1

void la_media_adv_format_text(la_vstring *vstr,void *data,int indent)

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  
  if (*data == '\x01') {
    la_vstring_append_sprintf
              (vstr,"%*s-- Unparseable Media Advisory message\n",(ulong)(uint)indent,"");
    return;
  }
  uVar3 = 0;
  la_vstring_append_sprintf
            (vstr,"%*sMedia Advisory, version %d:\n",(ulong)(uint)indent,"",
             (ulong)*(byte *)((long)data + 1));
  uVar6 = indent + 1;
  lVar2 = 0;
  do {
    if ((&link_type_map[0].code)[lVar2] == *(char *)((long)data + 6)) {
      uVar3 = *(undefined8 *)((long)&link_type_map[0].description + lVar2);
      break;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x80);
  pcVar5 = "lost";
  if (*(char *)((long)data + 5) == 'E') {
    pcVar5 = "established";
  }
  la_vstring_append_sprintf
            (vstr,"%*sLink %s %s at %02d:%02d:%02d UTC\n",(ulong)uVar6,"",uVar3,pcVar5,
             (ulong)*(byte *)((long)data + 2),(ulong)*(byte *)((long)data + 3),
             (ulong)*(byte *)((long)data + 4));
  la_vstring_append_sprintf(vstr,"%*sAvailable links: ",(ulong)uVar6);
  sVar1 = strlen((char *)**(undefined8 **)((long)data + 8));
  if (sVar1 != 0) {
    sVar4 = 0;
    do {
      lVar2 = 0;
      do {
        if ((&link_type_map[0].code)[lVar2] == *(char *)(**(long **)((long)data + 8) + sVar4)) {
          uVar3 = *(undefined8 *)((long)&link_type_map[0].description + lVar2);
          goto LAB_001543fb;
        }
        lVar2 = lVar2 + 0x10;
      } while (lVar2 != 0x80);
      uVar3 = 0;
LAB_001543fb:
      pcVar5 = "%s, ";
      if (sVar4 == sVar1 - 1) {
        pcVar5 = "%s\n";
      }
      la_vstring_append_sprintf(vstr,pcVar5,uVar3);
      sVar4 = sVar4 + 1;
    } while (sVar4 != sVar1);
  }
  if ((*(char **)((long)data + 0x10) != (char *)0x0) && (**(char **)((long)data + 0x10) != '\0')) {
    la_vstring_append_sprintf(vstr,"%*sText: %s\n",(ulong)uVar6,"");
    return;
  }
  return;
}

Assistant:

void la_media_adv_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_media_adv_msg const *msg = data;

	if(msg->err == true) {
		LA_ISPRINTF(vstr, indent, "-- Unparseable Media Advisory message\n");
		return;
	}

	LA_ISPRINTF(vstr, indent, "Media Advisory, version %d:\n", msg->version);
	indent++;

	LA_ISPRINTF(vstr, indent, "Link %s %s at %02d:%02d:%02d UTC\n",
			get_link_description(msg->current_link),
			(msg->state == 'E') ? "established" : "lost",
			msg->hour, msg->minute, msg->second
			);

	LA_ISPRINTF(vstr, indent, "Available links: ");
	size_t count = strlen(msg->available_links->str);
	for(size_t i = 0; i < count; i++) {
		char const *link = get_link_description(msg->available_links->str[i]);
		if(i == count - 1) {
			la_vstring_append_sprintf(vstr, "%s\n", link);
		} else {
			la_vstring_append_sprintf(vstr, "%s, ", link);
		}
	}

	if(msg->text != NULL && msg->text[0] != '\0') {
		LA_ISPRINTF(vstr, indent, "Text: %s\n", msg->text);
	}
}